

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O2

int write_FFSfile_attrs(FFSFile f,FMFormat_conflict format,void *data,attr_list attrs)

{
  int iVar1;
  int iVar2;
  char *attr_list;
  FFSEncodeVector pFVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  size_t *psVar7;
  iovec *piVar8;
  int attr_len;
  int id_len;
  long local_48;
  char *local_40;
  int indicator [2];
  
  iVar1 = format->format_index;
  id_len = 0;
  local_40 = get_server_ID_FMformat(format,&id_len);
  attr_len = 0;
  if (attrs == (attr_list)0x0) {
    attr_len = 0;
    attr_list = (char *)0x0;
    local_48 = 0;
  }
  else {
    local_48 = create_AttrBuffer();
    attr_list = (char *)encode_attr_for_xmit(attrs,local_48,&attr_len);
  }
  iVar2 = 0;
  if (f->file_org == Indexed) {
    iVar2 = attr_len;
  }
  attr_len = iVar2;
  init_format_info(f,iVar1);
  if ((f->info[iVar1].written_to_file == 0) && (iVar1 = write_format_to_file(f,format), iVar1 == 0))
  {
    return 0;
  }
  output_data_index(f,local_40,id_len,attr_list,attr_len);
  pFVar3 = FFSencode_vector(f->buf,format,data);
  iVar1 = 1;
  lVar5 = 0;
  for (psVar7 = &pFVar3->iov_len; ((FFSEncodeVec *)(psVar7 + -1))->iov_base != (void *)0x0;
      psVar7 = psVar7 + 2) {
    lVar5 = lVar5 + *psVar7;
    iVar1 = iVar1 + 1;
  }
  iVar2 = (int)((ulong)lVar5 >> 0x20);
  uVar6 = iVar2 + 0x3000000;
  indicator[0] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | iVar2 << 0x18;
  uVar6 = (uint)lVar5;
  indicator[1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  piVar8 = (iovec *)(pFVar3 + -1);
  pFVar3[-1].iov_len = 8;
  pFVar3[-1].iov_base = indicator;
  iVar2 = f->max_iov;
  do {
    if (iVar1 <= iVar2) {
      iVar2 = (*f->writev_func)(f->file_id,piVar8,iVar1,(int *)0x0,(char **)0x0);
      if (iVar2 == iVar1) {
        if (local_48 != 0) {
          free_AttrBuffer();
        }
        f->data_count = f->data_count + 1;
        update_fpos(f);
        iVar1 = 1;
      }
      else {
        puVar4 = (uint *)__errno_location();
        uVar6 = *puVar4;
LAB_00115763:
        iVar1 = 0;
        printf("Write failed, errno %d\n",(ulong)uVar6);
      }
      return iVar1;
    }
    iVar2 = (*f->writev_func)(f->file_id,piVar8,iVar2,(int *)0x0,(char **)0x0);
    if (iVar2 != f->max_iov) {
      puVar4 = (uint *)__errno_location();
      uVar6 = *puVar4;
      goto LAB_00115763;
    }
    iVar1 = iVar1 - iVar2;
    piVar8 = piVar8 + iVar2;
  } while( true );
}

Assistant:

extern int
write_FFSfile_attrs(FFSFile f, FMFormat format, void *data, attr_list attrs)
{
    DATA_LEN_TYPE byte_size;
    int index = format->format_index;
    int vec_count;
    FFSEncodeVector vec;
    int indicator[2];
    int id_len = 0;
    char *id = get_server_ID_FMformat(format, &id_len);
    int attr_len = 0;
    char *attr_block = NULL;
    AttrBuffer b = NULL;

    if (attrs) {
	b = create_AttrBuffer();
	attr_block = encode_attr_for_xmit(attrs, b, &attr_len);
    }

    attr_len = (f->file_org == Indexed)?attr_len:0;

    init_format_info(f, index);
    if (!f->info[index].written_to_file) {
	if (write_format_to_file(f, format) != 1) return 0;
    }

    output_data_index(f, id, id_len, attr_block, attr_len);
    //build_reverse_index(f, attr_list, attr_len);
    // Above ... deepak u need to replace attr_list with attr_block
    vec = FFSencode_vector(f->buf, format, data);
    vec_count = 0;
    byte_size = 0;
    while (vec[vec_count].iov_base != NULL) {
	byte_size += vec[vec_count].iov_len;
	vec_count++;
    }

    /*
     * next_data indicator is two 4-byte chunks in network byte order.
     * The top byte is 0x3.  The next byte is reserved for future use.
     * The following 6-bytes are the size of the data -- assume size fits
     * in a signed int.
     */
    indicator[0] = htonl((0x3 << 24) + (byte_size >> 32));
    indicator[1] = htonl(byte_size & 0xffffffff); 

    /* 
     *  utilize the fact that we have some blank vec entries *before the 
     *  beginning* of the vec we are given.  see ffs.c 
     */
    vec--;
    vec_count++;
    vec[0].iov_len = 8;
    vec[0].iov_base = indicator;
    while (vec_count > f->max_iov) {
	/* 
	 * if iovcnt is more than the number of chunks we can write in a 
	 * single AtomicWriteV, loop to write out max allowed.
	 */
	if (f->writev_func(f->file_id, (struct iovec *)vec, f->max_iov, 
			   NULL, NULL) != f->max_iov) {
	    printf("Write failed, errno %d\n", errno);
	    return 0;
	}
	vec_count -= f->max_iov;
	vec += f->max_iov;
    }
    if (f->writev_func(f->file_id, (struct iovec *)vec, vec_count, 
		       NULL, NULL) != vec_count) {
	printf("Write failed, errno %d\n", errno);
	return 0;
    }
    if (b) free_AttrBuffer(b);

    f->data_count++;
    update_fpos(f);
    return 1;
}